

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsInterface.cpp
# Opt level: O0

HighsStatus __thiscall
Highs::addColsInterface
          (Highs *this,HighsInt ext_num_new_col,double *ext_col_cost,double *ext_col_lower,
          double *ext_col_upper,HighsInt ext_num_new_nz,HighsInt *ext_a_start,HighsInt *ext_a_index,
          double *ext_a_value)

{
  bool bVar1;
  HighsStatus HVar2;
  HighsStatus HVar3;
  reference pvVar4;
  reference pvVar5;
  int in_ESI;
  long in_RDI;
  int in_R9D;
  string *in_stack_00000010;
  long in_stack_00000018;
  HighsInt iCol_2;
  HighsSparseMatrix local_a_matrix;
  HighsInt iCol_1;
  double cost_scale_value;
  HighsInt iCol;
  double bound_scale_value;
  bool local_has_infinite_cost;
  vector<double,_std::allocator<double>_> local_colUpper;
  vector<double,_std::allocator<double>_> local_colLower;
  vector<double,_std::allocator<double>_> local_colCost;
  HighsIndexCollection index_collection;
  HighsInt newNumCol;
  bool *lp_has_scaling;
  bool *useful_basis;
  HighsScale *scale;
  HighsBasis *basis;
  HighsLp *lp;
  HighsOptions *options;
  HighsStatus return_status;
  HighsLogOptions *in_stack_fffffffffffff9f8;
  HighsLogOptions *pHVar6;
  Highs *in_stack_fffffffffffffa00;
  undefined4 in_stack_fffffffffffffa08;
  HighsInt in_stack_fffffffffffffa0c;
  undefined4 uVar7;
  HEkk *in_stack_fffffffffffffa10;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffa18;
  allocator *paVar8;
  undefined4 in_stack_fffffffffffffa20;
  undefined4 in_stack_fffffffffffffa24;
  HighsIndexCollection *in_stack_fffffffffffffa28;
  HighsStatus in_stack_fffffffffffffa30;
  HighsStatus in_stack_fffffffffffffa34;
  HighsOptions *in_stack_fffffffffffffa38;
  undefined4 in_stack_fffffffffffffa40;
  HighsStatus in_stack_fffffffffffffa44;
  undefined8 in_stack_fffffffffffffa48;
  long lVar9;
  HighsLogOptions *in_stack_fffffffffffffa50;
  undefined1 *in_stack_fffffffffffffa58;
  Highs *in_stack_fffffffffffffa60;
  long in_stack_fffffffffffffa68;
  HighsInt max_scale_factor_exponent;
  HighsSparseMatrix *in_stack_fffffffffffffa70;
  double in_stack_fffffffffffffa78;
  undefined1 *large_matrix_value;
  undefined4 in_stack_fffffffffffffa80;
  undefined4 in_stack_fffffffffffffa84;
  int iVar10;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffa88;
  HighsIndexCollection *in_stack_fffffffffffffa90;
  HighsLogOptions *log_options;
  undefined8 in_stack_fffffffffffffa98;
  HighsInt HVar11;
  HighsSparseMatrix *this_00;
  char *in_stack_fffffffffffffaa0;
  HighsOptions *in_stack_fffffffffffffaa8;
  HighsVarType *in_stack_fffffffffffffac0;
  HighsInt num_new_col;
  HighsLp *in_stack_fffffffffffffac8;
  HighsLp *in_stack_fffffffffffffad0;
  double *in_stack_fffffffffffffae8;
  double dVar12;
  double *in_stack_fffffffffffffaf0;
  undefined7 in_stack_fffffffffffffaf8;
  undefined1 in_stack_fffffffffffffaff;
  undefined4 in_stack_fffffffffffffb00;
  undefined4 in_stack_fffffffffffffb04;
  undefined4 in_stack_fffffffffffffb10;
  HighsStatus HVar13;
  HighsSparseMatrix *this_01;
  allocator local_479;
  string local_478 [36];
  int local_454;
  undefined4 local_3e0;
  undefined1 local_3d9 [40];
  undefined1 local_3b1 [136];
  undefined1 local_329;
  undefined1 local_328 [31];
  undefined1 local_309 [32];
  HighsVarType local_2e9 [25];
  undefined4 local_2d0;
  int local_2cc;
  undefined4 local_2c8;
  vector<int,_std::allocator<int>_> local_2c0 [4];
  int local_25c;
  HighsLp *local_258;
  int local_24c;
  double local_248;
  allocator local_239;
  string local_238 [128];
  undefined4 local_1b8;
  undefined1 local_1b1 [135];
  undefined1 local_12a;
  vector<double,_std::allocator<double>_> local_128;
  vector<double,_std::allocator<double>_> local_108 [2];
  vector<double,_std::allocator<double>_> local_d8;
  int local_c0;
  undefined1 local_bc;
  undefined4 local_b8;
  int local_b4;
  undefined4 local_6c;
  byte *local_68;
  byte *local_60;
  long local_58;
  long local_50;
  HEkk *local_48;
  long local_40;
  HighsStatus local_38;
  int local_34;
  int local_14;
  HighsStatus local_4;
  
  HVar11 = (HighsInt)((ulong)in_stack_fffffffffffffa98 >> 0x20);
  local_38 = 0;
  local_40 = in_RDI + 0xaa8;
  if (in_ESI < 0) {
    return kError;
  }
  if (in_R9D < 0) {
    return kError;
  }
  if (in_ESI == 0) {
    return kOk;
  }
  local_34 = in_R9D;
  local_14 = in_ESI;
  if ((0 < in_ESI) &&
     (bVar1 = isColDataNull((HighsLogOptions *)
                            CONCAT44(in_stack_fffffffffffffb04,in_stack_fffffffffffffb00),
                            (double *)CONCAT17(in_stack_fffffffffffffaff,in_stack_fffffffffffffaf8),
                            in_stack_fffffffffffffaf0,in_stack_fffffffffffffae8), bVar1)) {
    return kError;
  }
  if ((0 < local_34) &&
     (bVar1 = isMatrixDataNull((HighsLogOptions *)
                               CONCAT44(in_stack_fffffffffffffb04,in_stack_fffffffffffffb00),
                               (HighsInt *)
                               CONCAT17(in_stack_fffffffffffffaff,in_stack_fffffffffffffaf8),
                               (HighsInt *)in_stack_fffffffffffffaf0,in_stack_fffffffffffffae8),
     bVar1)) {
    return kError;
  }
  local_48 = (HEkk *)(in_RDI + 0x138);
  local_50 = in_RDI + 0x70;
  local_58 = in_RDI + 0x340;
  local_60 = (byte *)(in_RDI + 0x72);
  local_68 = (byte *)(in_RDI + 0x344);
  if ((*(int *)(in_RDI + 0x13c) < 1) && (0 < local_34)) {
    return kError;
  }
  local_6c = *(int *)&local_48->callback_ + local_14;
  HighsIndexCollection::HighsIndexCollection((HighsIndexCollection *)in_stack_fffffffffffffa00);
  local_c0 = local_14;
  local_bc = 1;
  local_b8 = 0;
  local_b4 = local_14 + -1;
  std::allocator<double>::allocator((allocator<double> *)0x4d7f94);
  std::vector<double,std::allocator<double>>::vector<double_const*,void>
            ((vector<double,_std::allocator<double>_> *)
             CONCAT44(in_stack_fffffffffffffa44,in_stack_fffffffffffffa40),
             (double *)in_stack_fffffffffffffa38,
             (double *)CONCAT44(in_stack_fffffffffffffa34,in_stack_fffffffffffffa30),
             (allocator_type *)in_stack_fffffffffffffa28);
  std::allocator<double>::~allocator((allocator<double> *)0x4d7fc8);
  std::allocator<double>::allocator((allocator<double> *)0x4d8001);
  std::vector<double,std::allocator<double>>::vector<double_const*,void>
            ((vector<double,_std::allocator<double>_> *)
             CONCAT44(in_stack_fffffffffffffa44,in_stack_fffffffffffffa40),
             (double *)in_stack_fffffffffffffa38,
             (double *)CONCAT44(in_stack_fffffffffffffa34,in_stack_fffffffffffffa30),
             (allocator_type *)in_stack_fffffffffffffa28);
  std::allocator<double>::~allocator((allocator<double> *)0x4d8035);
  std::allocator<double>::allocator((allocator<double> *)0x4d806e);
  std::vector<double,std::allocator<double>>::vector<double_const*,void>
            ((vector<double,_std::allocator<double>_> *)
             CONCAT44(in_stack_fffffffffffffa44,in_stack_fffffffffffffa40),
             (double *)in_stack_fffffffffffffa38,
             (double *)CONCAT44(in_stack_fffffffffffffa34,in_stack_fffffffffffffa30),
             (allocator_type *)in_stack_fffffffffffffa28);
  std::allocator<double>::~allocator((allocator<double> *)0x4d80a2);
  local_12a = 0;
  HighsLogOptions::HighsLogOptions
            ((HighsLogOptions *)in_stack_fffffffffffffa00,in_stack_fffffffffffff9f8);
  assessCosts(in_stack_fffffffffffffa38,in_stack_fffffffffffffa34,in_stack_fffffffffffffa28,
              (vector<double,_std::allocator<double>_> *)
              CONCAT44(in_stack_fffffffffffffa24,in_stack_fffffffffffffa20),
              (bool *)in_stack_fffffffffffffa18,(double)in_stack_fffffffffffffa10);
  this_01 = (HighsSparseMatrix *)local_1b1;
  HVar13 = local_38;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_1b1 + 1),"assessCosts",(allocator *)this_01);
  HVar2 = interpretCallStatus(in_stack_fffffffffffffa50,
                              (HighsStatus)((ulong)in_stack_fffffffffffffa48 >> 0x20),
                              (HighsStatus)in_stack_fffffffffffffa48,
                              (string *)
                              CONCAT44(in_stack_fffffffffffffa44,in_stack_fffffffffffffa40));
  local_38 = HVar2;
  std::__cxx11::string::~string((string *)(local_1b1 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_1b1);
  HighsLogOptions::~HighsLogOptions((HighsLogOptions *)0x4d81aa);
  if (local_38 == kError) {
    local_4 = local_38;
    local_1b8 = 1;
    goto LAB_004d8f85;
  }
  HighsLogOptions::HighsLogOptions
            ((HighsLogOptions *)in_stack_fffffffffffffa00,in_stack_fffffffffffff9f8);
  pHVar6 = (HighsLogOptions *)0x0;
  HVar3 = assessBounds(in_stack_fffffffffffffaa8,in_stack_fffffffffffffaa0,HVar11,
                       in_stack_fffffffffffffa90,in_stack_fffffffffffffa88,
                       (vector<double,_std::allocator<double>_> *)
                       CONCAT44(in_stack_fffffffffffffa84,in_stack_fffffffffffffa80),
                       in_stack_fffffffffffffa78,in_stack_fffffffffffffac0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_238,"assessBounds",&local_239);
  local_38 = interpretCallStatus(in_stack_fffffffffffffa50,
                                 (HighsStatus)((ulong)in_stack_fffffffffffffa48 >> 0x20),
                                 (HighsStatus)in_stack_fffffffffffffa48,
                                 (string *)
                                 CONCAT44(in_stack_fffffffffffffa44,in_stack_fffffffffffffa40));
  std::__cxx11::string::~string(local_238);
  std::allocator<char>::~allocator((allocator<char> *)&local_239);
  HighsLogOptions::~HighsLogOptions((HighsLogOptions *)0x4d83de);
  if (local_38 == kError) {
    local_4 = local_38;
    local_1b8 = 1;
    goto LAB_004d8f85;
  }
  if (*(int *)&(local_48->analysis_).row_ap_density != 0) {
    bVar1 = boundScaleOk(in_stack_fffffffffffffa18,
                         (vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffa10,
                         in_stack_fffffffffffffa0c,(double)in_stack_fffffffffffffa00);
    if (!bVar1) {
      highsLogUser((HighsLogOptions *)(in_RDI + 0xe28),kError,
                   "User bound scaling yields infinite bound\n");
      local_4 = kError;
      local_1b8 = 1;
      goto LAB_004d8f85;
    }
    local_248 = std::pow<int,int>(0,0x4d852b);
    for (local_24c = 0; dVar12 = local_248, local_24c < local_14; local_24c = local_24c + 1) {
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](local_108,(long)local_24c);
      *pvVar4 = dVar12 * *pvVar4;
      dVar12 = local_248;
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](&local_128,(long)local_24c);
      *pvVar4 = dVar12 * *pvVar4;
    }
  }
  if (*(int *)((long)&(local_48->analysis_).row_ap_density + 4) != 0) {
    bVar1 = costScaleOk(in_stack_fffffffffffffa18,
                        (HighsInt)((ulong)in_stack_fffffffffffffa10 >> 0x20),
                        (double)CONCAT44(in_stack_fffffffffffffa0c,in_stack_fffffffffffffa08));
    if (!bVar1) {
      highsLogUser((HighsLogOptions *)(in_RDI + 0xe28),kError,
                   "User cost scaling yields infinite cost\n");
      local_4 = kError;
      local_1b8 = 1;
      goto LAB_004d8f85;
    }
    in_stack_fffffffffffffad0 = (HighsLp *)std::pow<int,int>(0,0x4d869c);
    local_258 = in_stack_fffffffffffffad0;
    for (local_25c = 0; local_25c < local_14; local_25c = local_25c + 1) {
      in_stack_fffffffffffffac8 = local_258;
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](&local_d8,(long)local_25c);
      *pvVar4 = (double)in_stack_fffffffffffffac8 * *pvVar4;
    }
  }
  appendColsToLpVectors
            ((HighsLp *)CONCAT44(in_stack_fffffffffffffa44,in_stack_fffffffffffffa40),
             (HighsInt)((ulong)in_stack_fffffffffffffa38 >> 0x20),
             (vector<double,_std::allocator<double>_> *)
             CONCAT44(in_stack_fffffffffffffa34,in_stack_fffffffffffffa30),
             (vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffa28,
             (vector<double,_std::allocator<double>_> *)
             CONCAT44(in_stack_fffffffffffffa24,in_stack_fffffffffffffa20));
  HighsSparseMatrix::HighsSparseMatrix
            ((HighsSparseMatrix *)CONCAT44(in_stack_fffffffffffffa34,in_stack_fffffffffffffa30));
  local_2cc = local_14;
  local_2c8 = *(undefined4 *)((long)&local_48->callback_ + 4);
  local_2d0 = 1;
  if (local_34 == 0) {
    local_3e0 = 0;
    std::vector<int,_std::allocator<int>_>::assign
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffa00,(size_type)pHVar6,
               (value_type_conflict2 *)0x4d8c51);
LAB_004d8c55:
    HighsSparseMatrix::HighsSparseMatrix
              ((HighsSparseMatrix *)CONCAT44(in_stack_fffffffffffffa34,in_stack_fffffffffffffa30),
               (HighsSparseMatrix *)((long)&(local_48->analysis_).model_name_.field_2 + 8));
    HighsSparseMatrix::addCols
              (this_01,(HighsSparseMatrix *)CONCAT44(HVar13,HVar2),
               (int8_t *)CONCAT44(HVar3,in_stack_fffffffffffffb10));
    HighsSparseMatrix::~HighsSparseMatrix((HighsSparseMatrix *)in_stack_fffffffffffffa00);
    num_new_col = (HighsInt)((ulong)in_stack_fffffffffffffac0 >> 0x20);
    HVar11 = (HighsInt)((ulong)in_stack_fffffffffffffa58 >> 0x20);
    if ((*local_68 & 1) != 0) {
      std::vector<double,_std::allocator<double>_>::resize
                ((vector<double,_std::allocator<double>_> *)
                 CONCAT44(in_stack_fffffffffffffa24,in_stack_fffffffffffffa20),
                 (size_type)in_stack_fffffffffffffa18);
      local_454 = 0;
      while( true ) {
        num_new_col = (HighsInt)((ulong)in_stack_fffffffffffffac0 >> 0x20);
        HVar11 = (HighsInt)((ulong)in_stack_fffffffffffffa58 >> 0x20);
        max_scale_factor_exponent = (HighsInt)((ulong)in_stack_fffffffffffffa68 >> 0x20);
        if (local_14 <= local_454) break;
        pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(local_58 + 0x18),
                            (long)(*(int *)&local_48->callback_ + local_454));
        *pvVar4 = 1.0;
        local_454 = local_454 + 1;
      }
      *(undefined4 *)(local_58 + 8) = local_6c;
      HighsSparseMatrix::applyRowScale
                ((HighsSparseMatrix *)CONCAT44(in_stack_fffffffffffffa44,in_stack_fffffffffffffa40),
                 (HighsScale *)in_stack_fffffffffffffa38);
      std::vector<double,_std::allocator<double>_>::operator[]
                ((vector<double,_std::allocator<double>_> *)(local_58 + 0x18),
                 (long)*(int *)&local_48->callback_);
      HighsSparseMatrix::considerColScaling
                (in_stack_fffffffffffffa70,max_scale_factor_exponent,
                 (double *)in_stack_fffffffffffffa60);
    }
    if ((*local_60 & 1) != 0) {
      appendNonbasicColsToBasisInterface(in_stack_fffffffffffffa60,HVar11);
    }
    paVar8 = &local_479;
    in_stack_fffffffffffffa10 = local_48;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_478,"",paVar8);
    HighsLp::addColNames(in_stack_fffffffffffffad0,(string *)in_stack_fffffffffffffac8,num_new_col);
    std::__cxx11::string::~string(local_478);
    std::allocator<char>::~allocator((allocator<char> *)&local_479);
    *(int *)&local_48->callback_ = local_14 + *(int *)&local_48->callback_;
    uVar7 = CONCAT13(1,(int3)in_stack_fffffffffffffa0c);
    if (((local_48->analysis_).multi_finished & 1) == 0) {
      uVar7 = CONCAT13(local_12a,(int3)in_stack_fffffffffffffa0c);
    }
    *(byte *)&(local_48->analysis_).multi_finished = (byte)((uint)uVar7 >> 0x18) & 1;
    invalidateModelStatusSolutionAndInfo(in_stack_fffffffffffffa00);
    HEkk::addCols(in_stack_fffffffffffffa10,(HighsLp *)CONCAT44(uVar7,in_stack_fffffffffffffa08),
                  (HighsSparseMatrix *)in_stack_fffffffffffffa00);
    if (*(int *)(in_RDI + 0x4d0) != 0) {
      completeHessian((HighsInt)((ulong)in_stack_fffffffffffffa10 >> 0x20),
                      (HighsHessian *)CONCAT44(uVar7,in_stack_fffffffffffffa08));
    }
  }
  else {
    in_stack_fffffffffffffac0 = local_2e9;
    std::allocator<int>::allocator((allocator<int> *)0x4d87d0);
    std::vector<int,std::allocator<int>>::vector<int_const*,void>
              ((vector<int,_std::allocator<int>_> *)
               CONCAT44(in_stack_fffffffffffffa44,in_stack_fffffffffffffa40),
               (int *)in_stack_fffffffffffffa38,
               (int *)CONCAT44(in_stack_fffffffffffffa34,in_stack_fffffffffffffa30),
               (allocator_type *)in_stack_fffffffffffffa28);
    std::vector<int,_std::allocator<int>_>::operator=
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffa10,
               (vector<int,_std::allocator<int>_> *)
               CONCAT44(in_stack_fffffffffffffa0c,in_stack_fffffffffffffa08));
    std::vector<int,_std::allocator<int>_>::~vector
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffa10);
    std::allocator<int>::~allocator((allocator<int> *)0x4d8836);
    std::vector<int,_std::allocator<int>_>::resize
              ((vector<int,_std::allocator<int>_> *)
               CONCAT44(in_stack_fffffffffffffa24,in_stack_fffffffffffffa20),
               (size_type)in_stack_fffffffffffffa18);
    iVar10 = local_34;
    pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](local_2c0,(long)local_14);
    *pvVar5 = iVar10;
    log_options = (HighsLogOptions *)(&in_stack_00000010->_M_dataplus + (long)local_34 * 4);
    this_00 = (HighsSparseMatrix *)local_309;
    std::allocator<int>::allocator((allocator<int> *)0x4d88b6);
    std::vector<int,std::allocator<int>>::vector<int_const*,void>
              ((vector<int,_std::allocator<int>_> *)
               CONCAT44(in_stack_fffffffffffffa44,in_stack_fffffffffffffa40),
               (int *)in_stack_fffffffffffffa38,
               (int *)CONCAT44(in_stack_fffffffffffffa34,in_stack_fffffffffffffa30),
               (allocator_type *)in_stack_fffffffffffffa28);
    in_stack_fffffffffffffa60 = (Highs *)(local_309 + 1);
    std::vector<int,_std::allocator<int>_>::operator=
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffa10,
               (vector<int,_std::allocator<int>_> *)
               CONCAT44(in_stack_fffffffffffffa0c,in_stack_fffffffffffffa08));
    std::vector<int,_std::allocator<int>_>::~vector
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffa10);
    std::allocator<int>::~allocator((allocator<int> *)0x4d890e);
    in_stack_fffffffffffffa70 = (HighsSparseMatrix *)(in_stack_00000018 + (long)local_34 * 8);
    large_matrix_value = &local_329;
    std::allocator<double>::allocator((allocator<double> *)0x4d8941);
    std::vector<double,std::allocator<double>>::vector<double_const*,void>
              ((vector<double,_std::allocator<double>_> *)
               CONCAT44(in_stack_fffffffffffffa44,in_stack_fffffffffffffa40),
               (double *)in_stack_fffffffffffffa38,
               (double *)CONCAT44(in_stack_fffffffffffffa34,in_stack_fffffffffffffa30),
               (allocator_type *)in_stack_fffffffffffffa28);
    in_stack_fffffffffffffa58 = local_328;
    std::vector<double,_std::allocator<double>_>::operator=
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffa10,
               (vector<double,_std::allocator<double>_> *)
               CONCAT44(in_stack_fffffffffffffa0c,in_stack_fffffffffffffa08));
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffa10);
    std::allocator<double>::~allocator((allocator<double> *)0x4d8993);
    HighsLogOptions::HighsLogOptions((HighsLogOptions *)in_stack_fffffffffffffa00,pHVar6);
    lVar9 = local_40 + 0x380;
    pHVar6 = (HighsLogOptions *)local_3b1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)(local_3b1 + 1),"LP",(allocator *)pHVar6);
    in_stack_fffffffffffffa44 =
         HighsSparseMatrix::assess
                   (this_00,log_options,in_stack_00000010,
                    (double)CONCAT44(iVar10,in_stack_fffffffffffffa80),(double)large_matrix_value);
    in_stack_fffffffffffffa38 = (HighsOptions *)local_3d9;
    in_stack_fffffffffffffa34 = local_38;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)(local_3d9 + 1),"assessMatrix",(allocator *)in_stack_fffffffffffffa38);
    in_stack_fffffffffffffa30 =
         interpretCallStatus(pHVar6,(HighsStatus)((ulong)lVar9 >> 0x20),(HighsStatus)lVar9,
                             (string *)CONCAT44(in_stack_fffffffffffffa44,in_stack_fffffffffffffa40)
                            );
    local_38 = in_stack_fffffffffffffa30;
    std::__cxx11::string::~string((string *)(local_3d9 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_3d9);
    std::__cxx11::string::~string((string *)(local_3b1 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_3b1);
    HighsLogOptions::~HighsLogOptions((HighsLogOptions *)0x4d8ad0);
    in_stack_fffffffffffffa68 = in_stack_00000018;
    if (local_38 != kError) goto LAB_004d8c55;
  }
  local_1b8 = 1;
  local_4 = local_38;
  HighsSparseMatrix::~HighsSparseMatrix((HighsSparseMatrix *)in_stack_fffffffffffffa00);
LAB_004d8f85:
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffa10);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffa10);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffa10);
  HighsIndexCollection::~HighsIndexCollection((HighsIndexCollection *)in_stack_fffffffffffffa00);
  return local_4;
}

Assistant:

HighsStatus Highs::addColsInterface(
    HighsInt ext_num_new_col, const double* ext_col_cost,
    const double* ext_col_lower, const double* ext_col_upper,
    HighsInt ext_num_new_nz, const HighsInt* ext_a_start,
    const HighsInt* ext_a_index, const double* ext_a_value) {
  HighsStatus return_status = HighsStatus::kOk;
  HighsOptions& options = options_;
  if (ext_num_new_col < 0) return HighsStatus::kError;
  if (ext_num_new_nz < 0) return HighsStatus::kError;
  if (ext_num_new_col == 0) return HighsStatus::kOk;
  if (ext_num_new_col > 0)
    if (isColDataNull(options.log_options, ext_col_cost, ext_col_lower,
                      ext_col_upper))
      return HighsStatus::kError;
  if (ext_num_new_nz > 0)
    if (isMatrixDataNull(options.log_options, ext_a_start, ext_a_index,
                         ext_a_value))
      return HighsStatus::kError;

  HighsLp& lp = model_.lp_;
  HighsBasis& basis = basis_;
  HighsScale& scale = lp.scale_;
  bool& useful_basis = basis.useful;
  bool& lp_has_scaling = lp.scale_.has_scaling;

  // Check that if nonzeros are to be added then the model has a positive number
  // of rows
  if (lp.num_row_ <= 0 && ext_num_new_nz > 0) return HighsStatus::kError;

  // Record the new number of columns
  HighsInt newNumCol = lp.num_col_ + ext_num_new_col;

  HighsIndexCollection index_collection;
  index_collection.dimension_ = ext_num_new_col;
  index_collection.is_interval_ = true;
  index_collection.from_ = 0;
  index_collection.to_ = ext_num_new_col - 1;

  // Take a copy of the cost and bounds that can be normalised
  std::vector<double> local_colCost{ext_col_cost,
                                    ext_col_cost + ext_num_new_col};
  std::vector<double> local_colLower{ext_col_lower,
                                     ext_col_lower + ext_num_new_col};
  std::vector<double> local_colUpper{ext_col_upper,
                                     ext_col_upper + ext_num_new_col};

  bool local_has_infinite_cost = false;
  return_status = interpretCallStatus(
      options_.log_options,
      assessCosts(options, lp.num_col_, index_collection, local_colCost,
                  local_has_infinite_cost, options.infinite_cost),
      return_status, "assessCosts");
  if (return_status == HighsStatus::kError) return return_status;
  // Assess the column bounds
  return_status = interpretCallStatus(
      options_.log_options,
      assessBounds(options, "Col", lp.num_col_, index_collection,
                   local_colLower, local_colUpper, options.infinite_bound),
      return_status, "assessBounds");
  if (return_status == HighsStatus::kError) return return_status;
  if (lp.user_bound_scale_) {
    // Assess and apply any user bound scaling
    if (!boundScaleOk(local_colLower, local_colUpper, lp.user_bound_scale_,
                      options.infinite_bound)) {
      highsLogUser(options_.log_options, HighsLogType::kError,
                   "User bound scaling yields infinite bound\n");
      return HighsStatus::kError;
    }
    double bound_scale_value = std::pow(2, lp.user_bound_scale_);
    for (HighsInt iCol = 0; iCol < ext_num_new_col; iCol++) {
      local_colLower[iCol] *= bound_scale_value;
      local_colUpper[iCol] *= bound_scale_value;
    }
  }
  if (lp.user_cost_scale_) {
    // Assess and apply any user cost scaling
    if (!costScaleOk(local_colCost, lp.user_cost_scale_,
                     options.infinite_cost)) {
      highsLogUser(options_.log_options, HighsLogType::kError,
                   "User cost scaling yields infinite cost\n");
      return HighsStatus::kError;
    }
    double cost_scale_value = std::pow(2, lp.user_cost_scale_);
    for (HighsInt iCol = 0; iCol < ext_num_new_col; iCol++)
      local_colCost[iCol] *= cost_scale_value;
  }
  // Append the columns to the LP vectors and matrix
  appendColsToLpVectors(lp, ext_num_new_col, local_colCost, local_colLower,
                        local_colUpper);
  // Form a column-wise HighsSparseMatrix of the new matrix columns so
  // that is easy to handle and, if there are nonzeros, it can be
  // normalised
  HighsSparseMatrix local_a_matrix;
  local_a_matrix.num_col_ = ext_num_new_col;
  local_a_matrix.num_row_ = lp.num_row_;
  local_a_matrix.format_ = MatrixFormat::kColwise;
  if (ext_num_new_nz) {
    local_a_matrix.start_ = {ext_a_start, ext_a_start + ext_num_new_col};
    local_a_matrix.start_.resize(ext_num_new_col + 1);
    local_a_matrix.start_[ext_num_new_col] = ext_num_new_nz;
    local_a_matrix.index_ = {ext_a_index, ext_a_index + ext_num_new_nz};
    local_a_matrix.value_ = {ext_a_value, ext_a_value + ext_num_new_nz};
    // Assess the matrix rows
    return_status =
        interpretCallStatus(options_.log_options,
                            local_a_matrix.assess(options.log_options, "LP",
                                                  options.small_matrix_value,
                                                  options.large_matrix_value),
                            return_status, "assessMatrix");
    if (return_status == HighsStatus::kError) return return_status;
  } else {
    // No nonzeros so, whether the constraint matrix is column-wise or
    // row-wise, adding the empty matrix is trivial. Complete the
    // setup of an empty column-wise HighsSparseMatrix of the new
    // matrix columns
    local_a_matrix.start_.assign(ext_num_new_col + 1, 0);
  }
  // Append the columns to LP matrix
  lp.a_matrix_.addCols(local_a_matrix);
  if (lp_has_scaling) {
    // Extend the column scaling factors
    scale.col.resize(newNumCol);
    for (HighsInt iCol = 0; iCol < ext_num_new_col; iCol++)
      scale.col[lp.num_col_ + iCol] = 1.0;
    scale.num_col = newNumCol;
    // Apply the existing row scaling to the new columns
    local_a_matrix.applyRowScale(scale);
    // Consider applying column scaling to the new columns.
    local_a_matrix.considerColScaling(options.allowed_matrix_scale_factor,
                                      &scale.col[lp.num_col_]);
  }
  // Update the basis corresponding to new nonbasic columns
  if (useful_basis) appendNonbasicColsToBasisInterface(ext_num_new_col);

  // Possibly add column names
  lp.addColNames("", ext_num_new_col);

  // Increase the number of columns in the LP
  lp.num_col_ += ext_num_new_col;
  assert(lpDimensionsOk("addCols", lp, options.log_options));

  // Interpret possible introduction of infinite costs
  lp.has_infinite_cost_ = lp.has_infinite_cost_ || local_has_infinite_cost;
  assert(lp.has_infinite_cost_ == lp.hasInfiniteCost(options.infinite_cost));

  // Deduce the consequences of adding new columns
  invalidateModelStatusSolutionAndInfo();

  // Determine any implications for simplex data
  ekk_instance_.addCols(lp, local_a_matrix);

  // Extend any Hessian with zeros on the diagonal
  if (this->model_.hessian_.dim_)
    completeHessian(lp.num_col_, this->model_.hessian_);
  return return_status;
}